

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O3

void __thiscall CTcLibParser::scan_needmacro(CTcLibParser *this,char *val)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar6 = val + -1;
  pcVar7 = pcVar6;
  do {
    cVar2 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
    iVar4 = isspace((int)cVar2);
    pcVar6 = pcVar6 + 1;
    pcVar3 = pcVar7;
  } while (iVar4 != 0);
  while ((cVar2 != '\0' && (iVar4 = isspace((int)cVar2), iVar4 == 0))) {
    cVar2 = pcVar3[1];
    pcVar3 = pcVar3 + 1;
  }
  pcVar5 = pcVar3 + -1;
  do {
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
    iVar4 = isspace((int)*pcVar1);
  } while (iVar4 != 0);
  (*this->_vptr_CTcLibParser[0x10])(this,pcVar7,(long)pcVar3 - (long)pcVar6,pcVar5);
  return;
}

Assistant:

void CTcLibParser::scan_needmacro(const char *val)
{
    const char *p;
    const char *macro_name;
    size_t macro_len;

    /* skip leading whitespace */
    for (p = val ; isspace(*p) ; ++p) ;

    /* the macro starts here */
    macro_name = p;

    /* find the next whitspace, which separates the token */
    for ( ; *p != '\0' && !isspace(*p) ; ++p) ;

    /* note the length of the macro name */
    macro_len = p - macro_name;

    /* skip the whitspace */
    for ( ; isspace(*p) ; ++p) ;

    /* process the parsed needmacro definition */
    scan_parsed_needmacro(macro_name, macro_len, p);
}